

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osc-spec.c
# Opt level: O1

int main(void)

{
  size_t sVar1;
  
  sVar1 = rtosc_message(buffer,0x100,"/oscillator/4/frequency","f",0x407b800000000000);
  assert_int_eq(0x20,(int)sVar1,"Creating Single Argument Message From OSC Spec",0x2b);
  assert_hex_eq((char *)"/oscillator/4/frequency",buffer,0x20,(long)(int)sVar1,
                "Validating Binary Representation of Message 1",0x2d);
  sVar1 = rtosc_message(buffer,0x100,"/foo","iisff",0x3ff3be76c0000000,0x4016b645a0000000,1000,
                        0xffffffff,"hello");
  assert_int_eq(0x28,(int)sVar1,"Creating Multi Argument Message From OSC Spec",0x32);
  assert_hex_eq((char *)"/foo",buffer,0x28,(long)(int)sVar1,
                "Validating Binary Representation of Message 2",0x34);
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    int sz = rtosc_message(buffer, 256, "/oscillator/4/frequency", "f", 440.0f);
    assert_int_eq(sizeof(message_one), sz,
            "Creating Single Argument Message From OSC Spec", __LINE__);
    assert_hex_eq((char*)message_one, buffer, sizeof(message_one), sz,
            "Validating Binary Representation of Message 1", __LINE__);

    sz = rtosc_message(buffer, 256, "/foo", "iisff",
                1000, -1, "hello", 1.234f, 5.678f);
    assert_int_eq(sizeof(message_two), sz,
            "Creating Multi Argument Message From OSC Spec", __LINE__);
    assert_hex_eq((char*)message_two, buffer, sizeof(message_two), sz,
            "Validating Binary Representation of Message 2", __LINE__);
    return test_summary();
}